

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

void __thiscall
t_haxe_generator::generate_deserialize_struct
          (t_haxe_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_haxe_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar1 = std::operator<<(out,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1," = new ");
  type_name_abi_cxx11_(&local_98,this,(t_type *)prefix_local,false,false);
  get_cap_name(&local_78,this,&local_98);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  poVar1 = std::operator<<(poVar1,"();");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_b8);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,".read(iprot);");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void t_haxe_generator::generate_deserialize_struct(ostream& out,
                                                   t_struct* tstruct,
                                                   string prefix) {
  out << indent() << prefix << " = new " << get_cap_name(type_name(tstruct)) << "();" << endl
      << indent() << prefix << ".read(iprot);" << endl;
}